

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void Function_Pool::Normalize
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  imageException *this;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM3_Qb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  FunctionTask local_170;
  
  Histogram(&histogram,in,startXIn,startYIn,width,height);
  if ((long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0x400) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Histogram size is not equal to 256");
    __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
  }
  uVar3 = 0xff;
  lVar1 = 0;
  uVar4 = 0;
  while( true ) {
    if (lVar1 == 0x100) break;
    uVar2 = (uint)lVar1;
    if ((ushort)lVar1 < (ushort)uVar4) {
      uVar2 = uVar4;
    }
    uVar5 = (uint)lVar1;
    if ((ushort)uVar3 < (ushort)lVar1) {
      uVar5 = uVar3;
    }
    if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] == 0) {
      uVar2 = uVar4;
      uVar5 = uVar3;
    }
    uVar3 = uVar5;
    lVar1 = lVar1 + 1;
    uVar4 = uVar2;
  }
  if ((ushort)uVar3 < (ushort)uVar4) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&value,0x100,(allocator_type *)&local_170);
    auVar6._0_8_ = 255.0 / (double)(int)((uVar4 & 0xffff) - (uVar3 & 0xffff));
    auVar6._8_8_ = 0;
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      auVar7._0_8_ = (double)(int)((int)lVar1 - (uVar3 & 0xffff));
      auVar7._8_8_ = in_XMM3_Qb;
      auVar7 = vfmadd213sd_fma(auVar7,auVar6,ZEXT816(0x3fe0000000000000));
      value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar1] = (uchar)(int)auVar7._0_8_;
    }
    FunctionTask::FunctionTask(&local_170);
    FunctionTask::LookupTable
              (&local_170,in,startXIn,startYIn,out,startXOut,startYOut,width,height,&value);
    FunctionTask::~FunctionTask(&local_170);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    penguinV::Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void Normalize( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        const std::vector<uint32_t> histogram = Histogram( in, startXIn, startYIn, width, height );
        if ( histogram.size() != 256u )
            throw imageException( "Histogram size is not equal to 256" );

        uint16_t minimum = 255u;
        uint16_t maximum = 0u;

        for ( uint16_t i = 0u; i < 256u; ++i ) {
            if ( histogram[i] > 0u ) {
                if ( maximum < i )
                    maximum = i;
                if ( minimum > i )
                    minimum = i;
            }
        }

        if ( minimum >= maximum ) {
            penguinV::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const double correction = 255.0 / (maximum - minimum);

            // We precalculate all values and store them in lookup table
            std::vector < uint8_t > value( 256 );

            for( uint16_t i = 0; i < 256; ++i )
                value[i] = static_cast <uint8_t>((i - minimum) * correction + 0.5);

            FunctionTask().LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
        }
    }